

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_table_driven_lite.h
# Opt level: O3

bool google::protobuf::internal::
     HandleEnum<google::protobuf::internal::(anonymous_namespace)::UnknownFieldHandler,(google::protobuf::internal::Cardinality)3>
               (ParseTable *table,CodedInputStream *input,MessageLite *msg,uint32 *presence,
               uint32 presence_index,int64 offset,uint32 tag,int field_number)

{
  byte bVar1;
  byte *pbVar2;
  EnumValidator p_Var3;
  long *plVar4;
  bool bVar5;
  ulong uVar6;
  ParseTableField *pPVar7;
  undefined8 *puVar8;
  void *pvVar9;
  uint uVar10;
  undefined8 *puVar11;
  uint32 first_byte_or_zero;
  int value;
  
  pbVar2 = input->buffer_;
  if (pbVar2 < input->buffer_end_) {
    bVar1 = *pbVar2;
    uVar6 = (ulong)bVar1;
    first_byte_or_zero = (uint32)bVar1;
    if ((char)bVar1 < '\0') goto LAB_0020afea;
    input->buffer_ = pbVar2 + 1;
  }
  else {
    first_byte_or_zero = 0;
LAB_0020afea:
    uVar6 = io::CodedInputStream::ReadVarint32Fallback(input,first_byte_or_zero);
    if ((long)uVar6 < 0) {
      return false;
    }
  }
  p_Var3 = table->aux[field_number].enums.validator;
  value = (int)uVar6;
  if ((p_Var3 != (EnumValidator)0x0) && (bVar5 = (*p_Var3)(value), !bVar5)) {
    anon_unknown_16::UnknownFieldHandler::Varint(msg,table,tag,value);
    return true;
  }
  pPVar7 = table->fields + presence[presence_index];
  pvVar9 = (msg->_internal_metadata_).ptr_;
  if (((ulong)pvVar9 & 1) != 0) {
    pvVar9 = *(void **)((ulong)pvVar9 & 0xfffffffffffffffe);
  }
  uVar10 = pPVar7->processing_type & 0x1f;
  if (uVar10 - 0x17 < 2) {
    puVar8 = (undefined8 *)((long)&msg->_vptr_MessageLite + (ulong)pPVar7->offset);
    puVar11 = (undefined8 *)*puVar8;
    if (puVar11 == puVar8 + 2) goto LAB_0020b01f;
  }
  else {
    if ((uVar10 != 9) && (uVar10 != 0xc)) {
      if (((uVar10 == 0xb) && (pvVar9 == (void *)0x0)) &&
         (plVar4 = *(long **)((long)&msg->_vptr_MessageLite + (ulong)pPVar7->offset),
         plVar4 != (long *)0x0)) {
        (**(code **)(*plVar4 + 8))();
      }
      goto LAB_0020b01f;
    }
    if ((pvVar9 != (void *)0x0) ||
       (puVar11 = *(undefined8 **)((long)&msg->_vptr_MessageLite + (ulong)pPVar7->offset),
       puVar11 == &fixed_address_empty_string_abi_cxx11_)) goto LAB_0020b01f;
    if ((puVar11 != (undefined8 *)0x0) && ((undefined8 *)*puVar11 != puVar11 + 2)) {
      operator_delete((undefined8 *)*puVar11);
    }
  }
  operator_delete(puVar11);
LAB_0020b01f:
  presence[presence_index] = field_number;
  *(int *)((long)&msg->_vptr_MessageLite + offset) = value;
  return true;
}

Assistant:

inline bool HandleEnum(const ParseTable& table, io::CodedInputStream* input,
                       MessageLite* msg, uint32* presence,
                       uint32 presence_index, int64 offset, uint32 tag,
                       int field_number) {
  int value;
  if (PROTOBUF_PREDICT_FALSE(
          (!WireFormatLite::ReadPrimitive<int, WireFormatLite::TYPE_ENUM>(
              input, &value)))) {
    return false;
  }

  AuxillaryParseTableField::EnumValidator validator =
      table.aux[field_number].enums.validator;
  if (validator == nullptr || validator(value)) {
    switch (cardinality) {
      case Cardinality_SINGULAR:
        SetField(msg, presence, presence_index, offset, value);
        break;
      case Cardinality_REPEATED:
        AddField(msg, offset, value);
        break;
      case Cardinality_ONEOF:
        ClearOneofField(table.fields[presence[presence_index]], msg->GetArena(),
                        msg);
        SetOneofField(msg, presence, presence_index, offset, field_number,
                      value);
        break;
      default:
        PROTOBUF_ASSUME(false);
    }
  } else {
    UnknownFieldHandler::Varint(msg, table, tag, value);
  }

  return true;
}